

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O1

MitchellFilter *
pbrt::MitchellFilter::Create(ParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  undefined4 extraout_var;
  uintptr_t iptr;
  string local_48;
  Float local_28;
  Float local_24;
  float local_20;
  float local_1c;
  MitchellFilter *pMVar3;
  
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"xradius","");
  local_1c = ParameterDictionary::GetOneFloat(parameters,&local_48,2.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"yradius","");
  local_20 = ParameterDictionary::GetOneFloat(parameters,&local_48,2.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"B","");
  local_24 = ParameterDictionary::GetOneFloat(parameters,&local_48,0.33333334);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"C","");
  local_28 = ParameterDictionary::GetOneFloat(parameters,&local_48,0.33333334);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  iVar2 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0xc0,8);
  pMVar3 = (MitchellFilter *)CONCAT44(extraout_var,iVar2);
  (pMVar3->radius).super_Tuple2<pbrt::Vector2,_float>.x = local_1c;
  (pMVar3->radius).super_Tuple2<pbrt::Vector2,_float>.y = local_20;
  pMVar3->B = local_24;
  pMVar3->C = local_28;
  local_48._M_dataplus._M_p = (pointer)((ulong)pMVar3 | 0x3000000000000);
  FilterSampler::FilterSampler(&pMVar3->sampler,(FilterHandle *)&local_48,alloc);
  return pMVar3;
}

Assistant:

MitchellFilter *MitchellFilter::Create(const ParameterDictionary &parameters,
                                       const FileLoc *loc, Allocator alloc) {
    // Find common filter parameters
    Float xw = parameters.GetOneFloat("xradius", 2.f);
    Float yw = parameters.GetOneFloat("yradius", 2.f);
    Float B = parameters.GetOneFloat("B", 1.f / 3.f);
    Float C = parameters.GetOneFloat("C", 1.f / 3.f);
    return alloc.new_object<MitchellFilter>(Vector2f(xw, yw), B, C, alloc);
}